

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O2

set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_> *
__thiscall
CsSignal::SignalBase::internal_receiverList
          (set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
           *__return_storage_ptr__,SignalBase *this,BentoAbstract *signalMethod_Bento)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *prVar3;
  read_handle senderListHandle;
  SlotBase *local_48;
  read_handle local_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40.m_ptr = &(this->m_connectList).m_obj;
  local_40.m_accessed = false;
  prVar3 = libguarded::
           rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
           ::read_handle::operator*(&local_40);
  while (prVar3 = *(rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
                    **)prVar3,
        prVar3 != (rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
                   *)0x0) {
    cVar2 = (**(code **)(**(long **)(prVar3 + 0x18) + 0x10))
                      (*(long **)(prVar3 + 0x18),signalMethod_Bento);
    if (cVar2 != '\0') {
      local_48 = *(SlotBase **)(prVar3 + 0x20);
      std::
      _Rb_tree<CsSignal::SlotBase*,CsSignal::SlotBase*,std::_Identity<CsSignal::SlotBase*>,std::less<CsSignal::SlotBase*>,std::allocator<CsSignal::SlotBase*>>
      ::_M_insert_unique<CsSignal::SlotBase*>
                ((_Rb_tree<CsSignal::SlotBase*,CsSignal::SlotBase*,std::_Identity<CsSignal::SlotBase*>,std::less<CsSignal::SlotBase*>,std::allocator<CsSignal::SlotBase*>>
                  *)__return_storage_ptr__,&local_48);
    }
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::read_handle::~read_handle(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::set<CsSignal::SlotBase *> CsSignal::SignalBase::internal_receiverList(
                  const Internal::BentoAbstract &signalMethod_Bento) const
{
   std::set<SlotBase *> retval;

   auto senderListHandle = m_connectList.lock_read();

   for (auto &item : *senderListHandle) {

      if (*(item.signalMethod) != signalMethod_Bento)  {
         continue;
      }

      retval.insert(const_cast<SlotBase *>(item.receiver));
   }

   return retval;
}